

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Twine.h
# Opt level: O0

StringRef __thiscall llvm::Twine::getSingleStringRef(Twine *this)

{
  StringRef SVar1;
  bool bVar2;
  NodeKind NVar3;
  const_pointer data;
  size_t length;
  Twine *this_local;
  unsigned_long local_10;
  
  bVar2 = isSingleStringRef(this);
  if (bVar2) {
    NVar3 = getLHSKind(this);
    switch(NVar3) {
    case EmptyKind:
      memset(&this_local,0,0x10);
      StringRef::StringRef((StringRef *)&this_local);
      break;
    default:
      llvm_unreachable_internal
                ("Out of sync with isSingleStringRef",
                 "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/third_party/llvm-project/include/llvm/ADT/Twine.h"
                 ,0x1ba);
    case CStringKind:
      StringRef::StringRef((StringRef *)&this_local,(this->LHS).cString);
      break;
    case StdStringKind:
      StringRef::StringRef((StringRef *)&this_local,(this->LHS).stdString);
      break;
    case StringRefKind:
      this_local = (Twine *)*(this->LHS).decUL;
      local_10 = (this->LHS).decUL[1];
      break;
    case SmallStringKind:
      data = SmallVectorTemplateCommon<char,_void>::data
                       ((SmallVectorTemplateCommon<char,_void> *)(this->LHS).twine);
      length = SmallVectorBase::size((SmallVectorBase *)(this->LHS).twine);
      StringRef::StringRef((StringRef *)&this_local,data,length);
    }
    SVar1.Length = local_10;
    SVar1.Data = (char *)this_local;
    return SVar1;
  }
  __assert_fail("isSingleStringRef() &&\"This cannot be had as a single stringref!\"",
                "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/third_party/llvm-project/include/llvm/ADT/Twine.h"
                ,0x1b8,"StringRef llvm::Twine::getSingleStringRef() const");
}

Assistant:

StringRef getSingleStringRef() const {
      assert(isSingleStringRef() &&"This cannot be had as a single stringref!");
      switch (getLHSKind()) {
      default: llvm_unreachable("Out of sync with isSingleStringRef");
      case EmptyKind:      return StringRef();
      case CStringKind:    return StringRef(LHS.cString);
      case StdStringKind:  return StringRef(*LHS.stdString);
      case StringRefKind:  return *LHS.stringRef;
      case SmallStringKind:
        return StringRef(LHS.smallString->data(), LHS.smallString->size());
      }
    }